

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::entry_point_args_argument_buffer_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,bool append_comma)

{
  uint id_00;
  bool bVar1;
  SPIRVariable *var_00;
  SPIRType *pSVar2;
  ulong uVar3;
  SPIREntryPoint *pSVar4;
  pointer ppVar5;
  size_type sVar6;
  char *pcVar7;
  uint *puVar8;
  uint local_2a4;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  uint32_t local_f4;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_b0;
  key_type local_a4;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_98;
  iterator itr;
  uint32_t buffer_binding;
  SPIRType *type;
  SPIRVariable *var;
  uint local_64;
  uint32_t id;
  uint32_t i;
  Bitset claimed_bindings;
  bool append_comma_local;
  CompilerMSL *this_local;
  string *ep_args;
  
  claimed_bindings.higher._M_h._M_single_bucket._6_1_ = 0;
  claimed_bindings.higher._M_h._M_single_bucket._7_1_ = append_comma;
  entry_point_arg_stage_in_abi_cxx11_(__return_storage_ptr__,this);
  Bitset::Bitset((Bitset *)&id);
  for (local_64 = 0; local_64 < 8; local_64 = local_64 + 1) {
    id_00 = this->argument_buffer_ids[local_64];
    if (id_00 != 0) {
      CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,id_00);
      var_00 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,id_00);
      pSVar2 = Compiler::get_variable_data_type((Compiler *)this,var_00);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      pSVar4 = Compiler::get_entry_point((Compiler *)this);
      local_a4.model = pSVar4->model;
      local_a4.desc_set = local_64;
      local_a4.binding = 0xfffffffc;
      local_98._M_cur =
           (__node_type *)
           ::std::
           unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
           ::find(&this->resource_bindings,&local_a4);
      local_b0._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::MSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::MSLResourceBinding,bool>>>>>
                     (&this->resource_bindings);
      bVar1 = ::std::__detail::operator!=(&local_98,&local_b0);
      if (bVar1) {
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                               *)&local_98);
        itr.
        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
        ._M_cur._4_4_ = (ppVar5->second).first.msl_buffer;
        ppVar5 = ::std::__detail::
                 _Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                               *)&local_98);
        (ppVar5->second).second = true;
      }
      else {
        bVar1 = Bitset::get((Bitset *)&id,local_64);
        if (bVar1) {
          itr.
          super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
          ._M_cur._4_4_ = this->next_metal_resource_index_buffer;
        }
        else {
          itr.
          super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
          ._M_cur._4_4_ = local_64;
        }
      }
      Bitset::set((Bitset *)&id,
                  itr.
                  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                  ._M_cur._4_4_);
      get_argument_address_space_abi_cxx11_(&local_f0,this,var_00);
      ::std::operator+(&local_d0,&local_f0," ");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)&local_f0);
      local_f4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar2->super_IVariant).self);
      sVar6 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&this->recursive_inputs,&local_f4);
      if (sVar6 == 0) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_220,this,pSVar2,0);
        ::std::operator+(&local_200,&local_220,"& ");
        pcVar7 = to_restrict(this,id_00,true);
        ::std::operator+(&local_1e0,&local_200,pcVar7);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_240,this,(ulong)id_00,1);
        ::std::operator+(&local_1c0,&local_1e0,&local_240);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_1c0);
        ::std::__cxx11::string::~string((string *)&local_240);
        ::std::__cxx11::string::~string((string *)&local_1e0);
        ::std::__cxx11::string::~string((string *)&local_200);
        ::std::__cxx11::string::~string((string *)&local_220);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_178,"void* ",&local_179);
        pcVar7 = to_restrict(this,id_00,true);
        ::std::operator+(&local_158,&local_178,pcVar7);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&local_1a0,this,(ulong)id_00,1);
        ::std::operator+(&local_138,&local_158,&local_1a0);
        ::std::operator+(&local_118,&local_138,"_vp");
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
        ::std::__cxx11::string::~string((string *)&local_118);
        ::std::__cxx11::string::~string((string *)&local_138);
        ::std::__cxx11::string::~string((string *)&local_1a0);
        ::std::__cxx11::string::~string((string *)&local_158);
        ::std::__cxx11::string::~string((string *)&local_178);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
      }
      convert_to_string<unsigned_int,_0>
                (&local_2a0,
                 (uint *)((long)&itr.
                                 super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                 ._M_cur + 4));
      ::std::operator+(&local_280," [[buffer(",&local_2a0);
      ::std::operator+(&local_260,&local_280,")]]");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_260);
      ::std::__cxx11::string::~string((string *)&local_260);
      ::std::__cxx11::string::~string((string *)&local_280);
      ::std::__cxx11::string::~string((string *)&local_2a0);
      local_2a4 = itr.
                  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                  ._M_cur._4_4_ + 1;
      puVar8 = ::std::max<unsigned_int>(&this->next_metal_resource_index_buffer,&local_2a4);
      this->next_metal_resource_index_buffer = *puVar8;
    }
  }
  entry_point_args_discrete_descriptors(this,__return_storage_ptr__);
  entry_point_args_builtin(this,__return_storage_ptr__);
  uVar3 = ::std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) && ((claimed_bindings.higher._M_h._M_single_bucket._7_1_ & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
  }
  claimed_bindings.higher._M_h._M_single_bucket._6_1_ = 1;
  Bitset::~Bitset((Bitset *)&id);
  if ((claimed_bindings.higher._M_h._M_single_bucket._6_1_ & 1) == 0) {
    ::std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::entry_point_args_argument_buffer(bool append_comma)
{
	string ep_args = entry_point_arg_stage_in();
	Bitset claimed_bindings;

	for (uint32_t i = 0; i < kMaxArgumentBuffers; i++)
	{
		uint32_t id = argument_buffer_ids[i];
		if (id == 0)
			continue;

		add_resource_name(id);
		auto &var = get<SPIRVariable>(id);
		auto &type = get_variable_data_type(var);

		if (!ep_args.empty())
			ep_args += ", ";

		// Check if the argument buffer binding itself has been remapped.
		uint32_t buffer_binding;
		auto itr = resource_bindings.find({ get_entry_point().model, i, kArgumentBufferBinding });
		if (itr != end(resource_bindings))
		{
			buffer_binding = itr->second.first.msl_buffer;
			itr->second.second = true;
		}
		else
		{
			// As a fallback, directly map desc set <-> binding.
			// If that was taken, take the next buffer binding.
			if (claimed_bindings.get(i))
				buffer_binding = next_metal_resource_index_buffer;
			else
				buffer_binding = i;
		}

		claimed_bindings.set(buffer_binding);

		ep_args += get_argument_address_space(var) + " ";

		if (recursive_inputs.count(type.self))
			ep_args += string("void* ") + to_restrict(id, true) + to_name(id) + "_vp";
		else
			ep_args += type_to_glsl(type) + "& " + to_restrict(id, true) + to_name(id);

		ep_args += " [[buffer(" + convert_to_string(buffer_binding) + ")]]";

		next_metal_resource_index_buffer = max(next_metal_resource_index_buffer, buffer_binding + 1);
	}

	entry_point_args_discrete_descriptors(ep_args);
	entry_point_args_builtin(ep_args);

	if (!ep_args.empty() && append_comma)
		ep_args += ", ";

	return ep_args;
}